

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# level.c
# Opt level: O0

Level * LoadLevel(char *name,int radius)

{
  int iVar1;
  ALLEGRO_BITMAP *pAVar2;
  ALLEGRO_SAMPLE *pAVar3;
  LevelState *pLVar4;
  int in_ESI;
  Level *in_RDI;
  Level *NewLev;
  ALLEGRO_FILE *file;
  undefined4 in_stack_00000010;
  int in_stack_0000004c;
  Level *in_stack_00000050;
  Level *local_28;
  Level *pLVar5;
  undefined4 in_stack_ffffffffffffffe8;
  undefined8 in_stack_fffffffffffffff8;
  
  iVar1 = (int)((ulong)in_stack_fffffffffffffff8 >> 0x20);
  local_28 = (Level *)0x0;
  ErrorText[0] = '\0';
  Error = 0;
  Lines = 1;
  input = (ALLEGRO_FILE *)al_fopen(in_RDI,"r");
  pLVar5 = (Level *)input;
  if ((Level *)input == (Level *)0x0) {
    snprintf(ErrorText,0x400,"Unable to load %s",in_RDI);
  }
  else {
    local_28 = NewLevel();
    LoadMaterials(pLVar5);
    if (((Error == 0) && (LoadVertices(pLVar5), Error == 0)) &&
       (LoadTriangles(NewLev,iVar1), Error == 0)) {
      do {
        FixVerts(in_RDI,in_ESI);
        iVar1 = FixEdges(in_stack_00000050,in_stack_0000004c);
      } while (iVar1 != 0);
      AddEdges(NewLev);
      LoadObjectTypes(in_RDI,in_ESI);
      if (Error == 0) {
        pAVar2 = ObtainBitmap((char *)CONCAT44(in_ESI,in_stack_ffffffffffffffe8));
        local_28->DoorOpen = pAVar2;
        if (pAVar2 == (ALLEGRO_BITMAP *)0x0) {
          snprintf(ErrorText,0x400,"Unable to obtain dooropen sprite");
        }
        else {
          pAVar2 = ObtainBitmap((char *)CONCAT44(in_ESI,in_stack_ffffffffffffffe8));
          local_28->DoorShut = pAVar2;
          if (pAVar2 == (ALLEGRO_BITMAP *)0x0) {
            snprintf(ErrorText,0x400,"Unable to obtain doorshut sprite");
          }
          else {
            (local_28->Door).Image = local_28->DoorShut;
            pAVar3 = ObtainSample((char *)CONCAT44(in_ESI,in_stack_ffffffffffffffe8));
            (local_28->Door).CollectNoise = pAVar3;
            (local_28->Door).Radius = in_ESI + 0xe;
            local_28->TotalObjects = 0;
            LoadObjects(in_RDI);
            if (Error == 0) {
              AddTriangles(pLVar5);
              ScaleAndAddObjects(pLVar5);
              SplitTree(&in_RDI->DisplayTree);
              OrderTree((QuadTreeNode *)CONCAT44(radius,in_stack_00000010),file._4_4_);
              OrderTree((QuadTreeNode *)CONCAT44(radius,in_stack_00000010),file._4_4_);
              OrderTree((QuadTreeNode *)CONCAT44(radius,in_stack_00000010),file._4_4_);
              LoadStats((Level *)0x10f76c);
              if (Error == 0) {
                pLVar4 = BorrowState((Level *)CONCAT44(in_ESI,in_stack_ffffffffffffffe8));
                local_28->InitialState = pLVar4;
                return local_28;
              }
            }
          }
        }
      }
    }
  }
  if (pLVar5 != (Level *)0x0) {
    al_fclose(pLVar5);
  }
  if (local_28 != (Level *)0x0) {
    FreeLevel(pLVar5);
  }
  return (Level *)0x0;
}

Assistant:

struct Level *LoadLevel(char const *name, int radius)
{
   ALLEGRO_FILE *file;
   struct Level *NewLev = NULL;

   ErrorText[0] = '\0';         /* set ErrorText to be a zero length string
                                   so that it will be obvious later if anything has set the error flag
                                   but not produced a verbose explanation of the error */
   Error = 0;                   /* reset error flag as no error has occurred yet */
   Lines = 1;                   /* first line is line 1 */

   /* attempt to open named level file */
   file = al_fopen(name, "r");
   input = file;

   if (!input) {
      snprintf(ErrorText, sizeof(ErrorText), "Unable to load %s", name);
      goto error;
   }

   /* allocate and initially set up new level structure */
   NewLev = NewLevel();

   /* load materials, vertices & triangles in that order */
   LoadMaterials(NewLev);
   if (Error) {
      goto error;
   }
   LoadVertices(NewLev);
   if (Error) {
      goto error;
   }
   LoadTriangles(NewLev, radius);
   if (Error) {
      goto error;
   }

   /* do a repeat 'fix' of vertices and fix of edges until we have
      no edge errors - see algorithm descriptions elsewhere in this
      file */
   do
      FixVerts(NewLev, radius);
   while (FixEdges(NewLev, radius));

   /* now that edges are al_fixed, add them to the collision tree */
   AddEdges(NewLev);

   /* load ordinary object types */
   LoadObjectTypes(NewLev, radius);
   if (Error) {
      goto error;
   }

   /* load special case object: door */
   if (!(NewLev->DoorOpen = ObtainBitmap("dooropen"))) {
      snprintf(ErrorText, sizeof(ErrorText),
                "Unable to obtain dooropen sprite");
      goto error;
   }
   if (!(NewLev->DoorShut = ObtainBitmap("doorshut"))) {
      snprintf(ErrorText, sizeof(ErrorText),
                "Unable to obtain doorshut sprite");
      goto error;
   }
   NewLev->Door.Image = NewLev->DoorShut;
   NewLev->Door.CollectNoise = ObtainSample("dooropen");
   NewLev->Door.Radius = 14 + radius;

   /* load objects */
   NewLev->TotalObjects = 0;
   LoadObjects(NewLev);
   if (Error) {
      goto error;
   }

   /* complete display tree additions */
   AddTriangles(NewLev);
   ScaleAndAddObjects(NewLev);

   /* order things for drawing */
   SplitTree(&NewLev->DisplayTree);
   OrderTree(&NewLev->DisplayTree, false);
   OrderTree(&NewLev->DisplayTree, true);
   OrderTree(&NewLev->CollisionTree, false);

   /* load static level stuff - player start pos, etc */
   LoadStats(NewLev);
   if (Error) {
      goto error;
   }

   /* make a copy of the initial state */
   NewLev->InitialState = BorrowState(NewLev);

   /* return level */
   return NewLev;

error:
   /* close input file */
   if (file)
      al_fclose(file);

   if (NewLev)
      FreeLevel(NewLev);

   return NULL;
}